

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

void arg_log_r(ps_config_t *cmdln,ps_arg_t *defn,int32 doc,int32 lineno)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  void *__base;
  cmd_ln_val_t *pcVar4;
  char *pcVar5;
  long lVar6;
  char *fmt;
  int iVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ps_arg_t *ppVar11;
  size_t n_elem;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  long lVar17;
  
  pcVar5 = defn->name;
  if (pcVar5 == (char *)0x0) {
    iVar7 = 0;
    uVar14 = 4;
    uVar10 = 4;
  }
  else {
    ppVar11 = defn + 1;
    iVar7 = 0;
    iVar12 = 0;
    iVar9 = 0;
    do {
      sVar3 = strlen(pcVar5);
      iVar13 = (int)sVar3 + 1;
      if (iVar13 < iVar12) {
        iVar13 = iVar12;
      }
      iVar12 = iVar13;
      if (ppVar11[-1].deflt == (char *)0x0) {
        iVar13 = 6;
      }
      else {
        sVar3 = strlen(ppVar11[-1].deflt);
        iVar13 = (int)sVar3;
      }
      if (iVar9 <= iVar13) {
        iVar9 = iVar13;
      }
      pcVar5 = ppVar11->name;
      iVar7 = iVar7 + 1;
      ppVar11 = ppVar11 + 1;
    } while (pcVar5 != (char *)0x0);
    uVar14 = iVar12 + 4;
    uVar10 = iVar9 + 4;
  }
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar14,"[NAME]");
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar10,"[DEFLT]");
  pcVar5 = "     [DESCR]\n";
  if (doc == 0) {
    pcVar5 = "    [VALUE]\n";
  }
  err_msg(ERR_INFO,(char *)0x0,0,pcVar5);
  n_elem = (size_t)iVar7;
  __base = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x85);
  auVar2 = _DAT_00118e30;
  if (iVar7 < 1) {
    qsort(__base,n_elem,8,cmp_name);
  }
  else {
    lVar6 = n_elem - 1;
    auVar15._8_4_ = (int)lVar6;
    auVar15._0_8_ = lVar6;
    auVar15._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar15 = auVar15 ^ _DAT_00118e30;
    auVar16 = _DAT_00118e20;
    do {
      auVar18 = auVar16 ^ auVar2;
      if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                  auVar15._4_4_ < auVar18._4_4_) & 1)) {
        *(ps_arg_t **)((long)__base + lVar6) = defn;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        *(ps_arg_t **)((long)__base + lVar6 + 8) = defn + 1;
      }
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar17 + 2;
      lVar6 = lVar6 + 0x10;
      defn = defn + 2;
    } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar6);
    qsort(__base,n_elem,8,cmp_name);
    if (0 < iVar7) {
      sVar8 = 0;
      do {
        err_msg(ERR_INFO,(char *)0x0,0,"-%-*s",(ulong)uVar14,
                **(undefined8 **)((long)__base + sVar8 * 8));
        pcVar5 = *(char **)(*(long *)((long)__base + sVar8 * 8) + 0x10);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "";
        }
        err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar10,pcVar5);
        puVar1 = *(undefined8 **)((long)__base + sVar8 * 8);
        if (doc == 0) {
          pcVar4 = cmd_ln_access_r(cmdln,(char *)*puVar1);
          if (pcVar4 != (cmd_ln_val_t *)0x0) {
            switch(*(undefined4 *)(*(long *)((long)__base + sVar8 * 8) + 8)) {
            case 2:
            case 3:
              pcVar5 = (char *)(pcVar4->val).ptr;
              fmt = "    %ld";
              goto LAB_0010efed;
            case 4:
            case 5:
              err_msg(ERR_INFO,(char *)0x0,0,"    %e",(pcVar4->val).ptr);
              break;
            default:
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                      ,0xf3,"Unknown argument type: %d\n");
              break;
            case 8:
            case 9:
              pcVar5 = (char *)(pcVar4->val).ptr;
              goto LAB_0010efd4;
            case 0x10:
            case 0x11:
              pcVar5 = "yes";
              if ((pcVar4->val).ptr == (void *)0x0) {
                pcVar5 = "no";
              }
              goto LAB_0010efdd;
            }
          }
        }
        else {
          pcVar5 = (char *)puVar1[3];
LAB_0010efd4:
          if (pcVar5 != (char *)0x0) {
LAB_0010efdd:
            fmt = "    %s";
LAB_0010efed:
            err_msg(ERR_INFO,(char *)0x0,0,fmt,pcVar5);
          }
        }
        err_msg(ERR_INFO,(char *)0x0,0,"\n");
        sVar8 = sVar8 + 1;
      } while (n_elem != sVar8);
    }
  }
  ckd_free(__base);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

static void
arg_log_r(ps_config_t *cmdln, const ps_arg_t * defn, int32 doc, int32 lineno)
{
    ps_arg_t const **pos;
    int32 i, n;
    int32 namelen, deflen;
    cmd_ln_val_t const *vp;

    /* No definitions, do nothing. */
    if (defn == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    namelen += 4;
    deflen += 4;
    if (lineno)
        E_INFO("%-*s", namelen, "[NAME]");
    else
        E_INFOCONT("%-*s", namelen, "[NAME]");
    E_INFOCONT("%-*s", deflen, "[DEFLT]");
    if (doc) {
        E_INFOCONT("     [DESCR]\n");
    }
    else {
        E_INFOCONT("    [VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        if (lineno)
            E_INFO("-%-*s", namelen, pos[i]->name);
        else
            E_INFOCONT("-%-*s", namelen, pos[i]->name);
        if (pos[i]->deflt)
            E_INFOCONT("%-*s", deflen, pos[i]->deflt);
        else
            E_INFOCONT("%-*s", deflen, "");
        if (doc) {
            if (pos[i]->doc)
                E_INFOCONT("    %s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    E_INFOCONT("    %ld", vp->val.i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    E_INFOCONT("    %e", vp->val.fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->val.ptr)
                        E_INFOCONT("    %s", (char *)vp->val.ptr);
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    E_INFOCONT("    %s", vp->val.i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        E_INFOCONT("\n");
    }
    ckd_free(pos);
    E_INFOCONT("\n");
}